

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::DeferredAssertionSyntax>
          (DeepCloneVisitor *this,DeferredAssertionSyntax *node,BumpAllocator *alloc)

{
  DeferredAssertionSyntax *pDVar1;
  Token local_50;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone(&node->hash,alloc);
  local_40 = parsing::Token::deepClone(&node->zero,alloc);
  local_50 = parsing::Token::deepClone(&node->finalKeyword,alloc);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DeferredAssertionSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_30,&local_40,&local_50);
  return &pDVar1->super_SyntaxNode;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }